

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall UnifiedRegex::Matcher::PushStats(Matcher *this,ContStack *contStack,Char *input)

{
  Type pRVar1;
  ulong uVar2;
  Cont *pCVar3;
  
  pRVar1 = this->stats;
  if (pRVar1 != (Type)0x0) {
    pRVar1->numPushes = pRVar1->numPushes + 1;
    uVar2 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    if (pRVar1->stackHWM < uVar2) {
      pRVar1->stackHWM = uVar2;
    }
  }
  if (this->w != (DebugWriter *)0x0) {
    DebugWriter::Print(this->w,L"PUSH ");
    pCVar3 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Top
                       (&contStack->
                         super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    (**pCVar3->_vptr_Cont)(pCVar3,this->w,input,*pCVar3->_vptr_Cont);
    return;
  }
  return;
}

Assistant:

void Matcher::PushStats(ContStack& contStack, const Char* const input) const
    {
        if (stats != 0)
        {
            stats->numPushes++;
            if (contStack.Position() > stats->stackHWM)
                stats->stackHWM = contStack.Position();
        }
        if (w != 0)
        {
            w->Print(_u("PUSH "));
            contStack.Top()->Print(w, input);
        }
    }